

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::detail::SerializeAttribute<tinyusdz::value::color3f>
               (string *attr_name,
               TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *attr,
               string *value_str,string *err)

{
  ostream *poVar1;
  Animatable<tinyusdz::value::color3f> *pAVar2;
  string *args;
  allocator *paVar3;
  bool bVar4;
  char *pcVar5;
  color3f value;
  ostringstream ss_e;
  stringstream value_ss;
  allocator local_379;
  color3f local_378;
  string local_368;
  string local_348;
  string local_328 [11];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  args = err;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  if (((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start) || ((attr->_empty & 1U) == 0)) {
    if (attr->_blocked == true) {
      ::std::__cxx11::string::assign((char *)value_str);
LAB_00242b80:
      bVar4 = true;
      goto LAB_00242d2d;
    }
    pAVar2 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::get_value
                       (attr);
    if (pAVar2->_has_value == true) {
      if (pAVar2->_blocked != true) {
        local_378.b = (pAVar2->_value).b;
        local_378.r = (pAVar2->_value).r;
        local_378.g = (pAVar2->_value).g;
        poVar1 = ::std::operator<<(local_1a0,"\"");
        to_xml_string<tinyusdz::value::color3f>(local_328,&local_378);
        poVar1 = ::std::operator<<(poVar1,(string *)local_328);
        ::std::operator<<(poVar1,"\"");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)value_str,(string *)local_328);
        ::std::__cxx11::string::_M_dispose();
        goto LAB_00242b80;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      poVar1 = ::std::operator<<((ostream *)local_328,"[error]");
      poVar1 = ::std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar1 = ::std::operator<<(poVar1,":");
      poVar1 = ::std::operator<<(poVar1,"SerializeAttribute");
      poVar1 = ::std::operator<<(poVar1,"():");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1b3);
      ::std::operator<<(poVar1," ");
      pcVar5 = "Failed to get the value at default time of `{}`";
      paVar3 = &local_379;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      poVar1 = ::std::operator<<((ostream *)local_328,"[error]");
      poVar1 = ::std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar1 = ::std::operator<<(poVar1,":");
      poVar1 = ::std::operator<<(poVar1,"SerializeAttribute");
      poVar1 = ::std::operator<<(poVar1,"():");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1b9);
      ::std::operator<<(poVar1," ");
      pcVar5 = "Failed to get the value of `{}`";
      paVar3 = (allocator *)&local_378;
    }
    ::std::__cxx11::string::string((string *)&local_348,pcVar5,paVar3);
    fmt::format<std::__cxx11::string>
              ((string *)&local_368,(fmt *)&local_348,(string *)attr_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar1 = ::std::operator<<((ostream *)local_328,(string *)&local_368);
    ::std::operator<<(poVar1,"\n");
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    poVar1 = ::std::operator<<((ostream *)local_328,"[error]");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = ::std::operator<<(poVar1,"SerializeAttribute");
    poVar1 = ::std::operator<<(poVar1,"():");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1a6);
    ::std::operator<<(poVar1," ");
    ::std::__cxx11::string::string
              ((string *)&local_348,"TODO: connection attribute",(allocator *)&local_378);
    fmt::format(&local_368,&local_348);
    poVar1 = ::std::operator<<((ostream *)local_328,(string *)&local_368);
    ::std::operator<<(poVar1,"\n");
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::string::_M_dispose();
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  bVar4 = false;
LAB_00242d2d:
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return bVar4;
}

Assistant:

bool SerializeAttribute(const std::string &attr_name,
                        const TypedAttributeWithFallback<Animatable<T>> &attr,
                        std::string &value_str, std::string *err) {
  std::stringstream value_ss;

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: connection attribute"));
  } else if (attr.is_blocked()) {
    // do nothing
    value_str = "";
    return true;
  } else {
    const Animatable<T> &animatable_value = attr.get_value();
    if (animatable_value.has_default()) {
      T value;
      if (animatable_value.get_scalar(&value)) {
        value_ss << "\"" << to_xml_string(value) << "\"";
      } else {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Failed to get the value at default time of `{}`", attr_name));
      }
    } else { 
      // no time-varying(timesamples) attribute in MaterialX.
      
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to get the value of `{}`", attr_name));
    }
  }

  value_str = value_ss.str();
  return true;
}